

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.h
# Opt level: O3

void __thiscall miniros::TopicInfo::TopicInfo(TopicInfo *this,string *_name,string *_datatype)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + _name->_M_string_length);
  (this->datatype)._M_dataplus._M_p = (pointer)&(this->datatype).field_2;
  pcVar1 = (_datatype->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->datatype,pcVar1,pcVar1 + _datatype->_M_string_length);
  return;
}

Assistant:

TopicInfo(const std::string& _name, const std::string& _datatype /*, const std::string& _md5sum*/)
      : name(_name), datatype(_datatype)
  //, md5sum(_md5sum)
  {
  }